

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void set_option_info(archive_string *info,int *opt,char *key,keytype type,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_R8;
  ulong uVar2;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [32];
  ulong local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  int local_5c;
  int d;
  char *s;
  undefined4 local_48;
  undefined4 uStack_44;
  char prefix;
  va_list ap;
  keytype type_local;
  char *key_local;
  int *opt_local;
  archive_string *info_local;
  
  uVar2 = local_f8;
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  s._7_1_ = ',';
  if (*opt == 0) {
    s._7_1_ = ' ';
  }
  ap[0].overflow_arg_area = local_118;
  ap[0]._0_8_ = &stack0x00000008;
  local_f0 = in_R9;
  switch(type) {
  case KEY_FLG:
    uStack_44 = 0x30;
    local_48 = 0x28;
    local_5c = (int)local_f8;
    pcVar1 = "";
    if ((int)local_f8 == 0) {
      pcVar1 = "!";
    }
    local_f8 = in_R8;
    archive_string_sprintf(info,"%c%s%s",(ulong)(uint)(int)s._7_1_,pcVar1,key);
    break;
  case KEY_STR:
    uStack_44 = 0x30;
    local_48 = 0x28;
    local_f8 = in_R8;
    archive_string_sprintf(info,"%c%s=%s",(ulong)(uint)(int)s._7_1_,key,uVar2);
    break;
  case KEY_INT:
    uStack_44 = 0x30;
    local_48 = 0x28;
    local_5c = (int)local_f8;
    uVar2 = local_f8 & 0xffffffff;
    local_f8 = in_R8;
    archive_string_sprintf(info,"%c%s=%d",(ulong)(uint)(int)s._7_1_,key,uVar2);
    break;
  case KEY_HEX:
    uStack_44 = 0x30;
    local_48 = 0x28;
    local_5c = (int)local_f8;
    uVar2 = local_f8 & 0xffffffff;
    local_f8 = in_R8;
    archive_string_sprintf(info,"%c%s=%x",(ulong)(uint)(int)s._7_1_,key,uVar2);
  }
  *opt = 1;
  return;
}

Assistant:

static void
set_option_info(struct archive_string *info, int *opt, const char *key,
    enum keytype type,  ...)
{
	va_list ap;
	char prefix;
	const char *s;
	int d;

	prefix = (*opt==0)? ' ':',';
	va_start(ap, type);
	switch (type) {
	case KEY_FLG:
		d = va_arg(ap, int);
		archive_string_sprintf(info, "%c%s%s",
		    prefix, (d == 0)?"!":"", key);
		break;
	case KEY_STR:
		s = va_arg(ap, const char *);
		archive_string_sprintf(info, "%c%s=%s",
		    prefix, key, s);
		break;
	case KEY_INT:
		d = va_arg(ap, int);
		archive_string_sprintf(info, "%c%s=%d",
		    prefix, key, d);
		break;
	case KEY_HEX:
		d = va_arg(ap, int);
		archive_string_sprintf(info, "%c%s=%x",
		    prefix, key, (unsigned int)d);
		break;
	}
	va_end(ap);

	*opt = 1;
}